

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildUnaryOp(int nToken,CNscPStackEntry *pValue)

{
  NscType NVar1;
  uchar *puVar2;
  size_t sVar3;
  CNwnDoubleLinkList *pCVar4;
  CNscPStackEntry *pCVar5;
  CNscContext *pCVar6;
  uint uVar7;
  int iVar8;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar9;
  CNwnDoubleLinkList *pNext;
  CNwnDoubleLinkList *pNext_1;
  char *pcVar10;
  NscPCode nOpCode;
  float fVar11;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar6 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pValue != (CNscPStackEntry *)0x0) {
      pCVar4 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar5 = (CNscPStackEntry *)(pValue->m_link).m_pNext;
      if (pCVar5 != pValue) {
        pCVar9 = (pValue->m_link).m_pPrev;
        (pCVar5->m_link).m_pPrev = pCVar9;
        pCVar9->m_pNext = (CNwnDoubleLinkList *)pCVar5;
        (pValue->m_link).m_pNext = &pValue->m_link;
        (pValue->m_link).m_pPrev = &pValue->m_link;
      }
      pCVar9 = &pCVar6->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar6->m_listEntryFree == pValue) {
        pCVar9 = pCVar4;
      }
      pCVar4 = pCVar9->m_pNext;
      (pValue->m_link).m_pNext = pCVar4;
      (pValue->m_link).m_pPrev = pCVar9;
      pCVar9->m_pNext = &pValue->m_link;
      pCVar4->m_pPrev = &pValue->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
    goto LAB_0014cfc3;
  }
  if (pValue == (CNscPStackEntry *)0x0) {
    __assert_fail("pValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0xa76,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
  }
  NVar1 = pValue->m_nType;
  if (NVar1 != NscType_Error) {
    if (nToken < 0x2d) {
      if (nToken == 0x21) {
        if (NVar1 == NscType_Integer) {
          if ((((g_pCtx->m_fOptExpression != true) || (pValue->m_nDataSize == 0)) ||
              (*(size_t *)pValue->m_pauchData != pValue->m_nDataSize)) ||
             ((int)*(size_t *)((long)pValue->m_pauchData + 8) != 0x34)) {
            puVar2 = pValue->m_pauchData;
            sVar3 = pValue->m_nDataSize;
            CNscPStackEntry::MakeRoom(this,sVar3);
            memcpy(this->m_pauchData + this->m_nDataSize,puVar2,sVar3);
            this->m_nDataSize = this->m_nDataSize + sVar3;
            nOpCode = NscPCode_LogicalNot;
            goto LAB_0014cf59;
          }
          iVar8 = CNscPStackEntry::GetInteger(pValue);
          uVar7 = (uint)(iVar8 == 0);
LAB_0014cdc5:
          CNscPStackEntry::PushConstantInteger(this,uVar7);
LAB_0014cf63:
          if (this->m_nType != NscType_Unknown) goto LAB_0014cfc3;
          this->m_nType = NscType_Integer;
          goto LAB_0014ced2;
        }
        pcVar10 = "!";
      }
      else {
        if (nToken != 0x2b) {
LAB_0014d001:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0xaf1,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
        }
        if ((NVar1 & ~NscType_Void) == NscType_Integer) {
          puVar2 = pValue->m_pauchData;
          sVar3 = pValue->m_nDataSize;
          CNscPStackEntry::MakeRoom(this,sVar3);
          memcpy(this->m_pauchData + this->m_nDataSize,puVar2,sVar3);
          this->m_nDataSize = this->m_nDataSize + sVar3;
          if (this->m_nType == NscType_Unknown) {
            this->m_nType = NVar1;
            goto LAB_0014ced2;
          }
          goto LAB_0014cfc3;
        }
        pcVar10 = "+";
      }
    }
    else if (nToken == 0x2d) {
      if (NVar1 == NscType_Float) {
        if ((((g_pCtx->m_fOptExpression == true) && (pValue->m_nDataSize != 0)) &&
            (*(size_t *)pValue->m_pauchData == pValue->m_nDataSize)) &&
           ((int)*(size_t *)((long)pValue->m_pauchData + 8) == 0x34)) {
          fVar11 = CNscPStackEntry::GetFloat(pValue);
          CNscPStackEntry::PushConstantFloat(this,-fVar11);
        }
        else {
          puVar2 = pValue->m_pauchData;
          sVar3 = pValue->m_nDataSize;
          CNscPStackEntry::MakeRoom(this,sVar3);
          memcpy(this->m_pauchData + this->m_nDataSize,puVar2,sVar3);
          this->m_nDataSize = this->m_nDataSize + sVar3;
          CNscPStackEntry::PushSimpleOp(this,NscPCode_Negate,NscType_Float);
        }
        if (this->m_nType != NscType_Unknown) goto LAB_0014cfc3;
        this->m_nType = NscType_Float;
        goto LAB_0014ced2;
      }
      if (NVar1 == NscType_Integer) {
        if (((g_pCtx->m_fOptExpression != true) || (pValue->m_nDataSize == 0)) ||
           ((*(size_t *)pValue->m_pauchData != pValue->m_nDataSize ||
            ((int)*(size_t *)((long)pValue->m_pauchData + 8) != 0x34)))) {
          puVar2 = pValue->m_pauchData;
          sVar3 = pValue->m_nDataSize;
          CNscPStackEntry::MakeRoom(this,sVar3);
          memcpy(this->m_pauchData + this->m_nDataSize,puVar2,sVar3);
          this->m_nDataSize = this->m_nDataSize + sVar3;
          nOpCode = NscPCode_Negate;
          goto LAB_0014cf59;
        }
        iVar8 = CNscPStackEntry::GetInteger(pValue);
        uVar7 = -iVar8;
        goto LAB_0014cdc5;
      }
      pcVar10 = "-";
    }
    else {
      if (nToken != 0x7e) goto LAB_0014d001;
      if (NVar1 == NscType_Integer) {
        if (((g_pCtx->m_fOptExpression == true) && (pValue->m_nDataSize != 0)) &&
           ((*(size_t *)pValue->m_pauchData == pValue->m_nDataSize &&
            ((int)*(size_t *)((long)pValue->m_pauchData + 8) == 0x34)))) {
          uVar7 = CNscPStackEntry::GetInteger(pValue);
          uVar7 = ~uVar7;
          goto LAB_0014cdc5;
        }
        puVar2 = pValue->m_pauchData;
        sVar3 = pValue->m_nDataSize;
        CNscPStackEntry::MakeRoom(this,sVar3);
        memcpy(this->m_pauchData + this->m_nDataSize,puVar2,sVar3);
        this->m_nDataSize = this->m_nDataSize + sVar3;
        nOpCode = NscPCode_BitwiseNot;
LAB_0014cf59:
        CNscPStackEntry::PushSimpleOp(this,nOpCode,NscType_Integer);
        goto LAB_0014cf63;
      }
      pcVar10 = "~";
    }
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar10);
  }
  if (this->m_nType != NscType_Unknown) {
LAB_0014cfc3:
    __assert_fail("m_nType == NscType_Unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0xee,"void CNscPStackEntry::SetType(NscType)");
  }
  this->m_nType = NscType_Error;
LAB_0014ced2:
  pCVar6 = g_pCtx;
  pCVar4 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar5 = (CNscPStackEntry *)(pValue->m_link).m_pNext;
  if (pCVar5 != pValue) {
    pCVar9 = (pValue->m_link).m_pPrev;
    (pCVar5->m_link).m_pPrev = pCVar9;
    pCVar9->m_pNext = (CNwnDoubleLinkList *)pCVar5;
    (pValue->m_link).m_pNext = &pValue->m_link;
    (pValue->m_link).m_pPrev = &pValue->m_link;
  }
  pCVar9 = &pCVar6->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar6->m_listEntryFree == pValue) {
    pCVar9 = pCVar4;
  }
  pCVar4 = pCVar9->m_pNext;
  (pValue->m_link).m_pNext = pCVar4;
  (pValue->m_link).m_pPrev = pCVar9;
  pCVar9->m_pNext = &pValue->m_link;
  pCVar4->m_pPrev = &pValue->m_link;
  return this;
}

Assistant:

YYSTYPE NscBuildUnaryOp (int nToken, YYSTYPE pValue)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else
	{
		switch (nToken)
		{
			case '+': //BIOWARE - Not supported by their compiler
				if (nType == NscType_Integer || 
					nType == NscType_Float)
				{
					pOut ->AppendData (pValue);
					pOut ->SetType (nType);
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "+");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '-':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							- pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else if (nType == NscType_Float)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantFloat (
							- pValue ->GetFloat ());
						pOut ->SetType (nType);
				}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "-");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '~':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							~ pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_BitwiseNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "~");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '!':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							! pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_LogicalNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "!");
					pOut ->SetType (NscType_Error);
				}
				break;

			default:
				assert (false);
				g_pCtx ->GenerateMessage (NscMessage_ErrorInternalCompilerError,
					"invalid unary operator");
				pOut ->SetType (NscType_Error);
				break;
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}